

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O2

void trimesh::get_contrib_cps<(trimesh::eGDIR)0,2>(mscomplex_ptr_t *msc,contrib_t *contrib)

{
  pointer pmVar1;
  pointer piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  type pmVar8;
  type pmVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  char *pcVar12;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  ostream *poVar15;
  runtime_error *prVar16;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  pointer piVar17;
  true_ *in_R8;
  uint *puVar18;
  int qa;
  reference local_610;
  int qaqa;
  int p;
  counting_iterator<int,_boost::use_default,_boost::use_default> local_5fc;
  contrib_t *local_5f8;
  int p_;
  shared_count local_5d8;
  reference local_5d0;
  long local_5c8;
  _Rb_tree_node_base *local_5c0;
  _Rb_tree_node_base *local_5b8;
  element_type *local_5b0;
  shared_count local_5a8;
  element_type *local_5a0;
  shared_count local_598;
  element_type *local_590;
  shared_count local_588;
  element_type *local_580;
  shared_count local_578;
  undefined1 local_570 [152];
  bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_4d8;
  bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_4c0;
  int p_1;
  undefined4 uStack_4a4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_4a0;
  shared_count local_490 [11];
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_438;
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_418;
  contrib_t contrib_map;
  stringstream ss;
  ostream local_3b8 [376];
  value_type pr;
  remove_cv_ref_t<decltype(msc_>m_canc_list___badpt__sliced_0__msc_>m_multires_version____badpt__transformed_bind_order_by_dir_index<(trimesh::eGDIR)0U>__msc___1_____badpt__filtered_bind_is_dim_pair<2,_odim>__msc___1___>
  canc_rng;
  
  contrib_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &contrib_map._M_t._M_impl.super__Rb_tree_header._M_header;
  contrib_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  contrib_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  contrib_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5f8 = contrib;
  contrib_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       contrib_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
  pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
  _p_1 = (pmVar8->m_canc_list).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_4a0._M_current = _p_1 + pmVar9->m_multires_version;
  local_580 = msc->px;
  local_578.pi_ = (msc->pn).pi_;
  if (local_578.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_578.pi_)->use_count_ = (local_578.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::
  bind<std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_4c0,(boost *)order_by_dir_index<(trimesh::eGDIR)0>,&local_580);
  boost::range_detail::forwarder<boost::range_detail::transform_holder>::operator()
            ((transform_holder<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
              *)&pr,(forwarder<boost::range_detail::transform_holder> *)
                    &boost::adaptors::(anonymous_namespace)::transformed,&local_4c0);
  boost::range_detail::operator|
            ((transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)&ss,(sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)&p_1,
             (transform_holder<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
              *)&pr);
  local_590 = msc->px;
  local_588.pi_ = (msc->pn).pi_;
  if (local_588.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_588.pi_)->use_count_ = (local_588.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::
  bind<bool,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_4d8,(boost *)is_dim_pair<2,1>,&local_590);
  boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
            ((filter_holder<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
              *)local_570,
             (forwarder<boost::range_detail::filter_holder> *)
             &boost::adaptors::(anonymous_namespace)::filtered,&local_4d8);
  boost::range_detail::operator|
            (&canc_rng,
             (transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)&ss,(filter_holder<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                     *)local_570);
  boost::detail::shared_count::~shared_count((shared_count *)(local_570 + 0x10));
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_4d8.l_.
                     super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                     .super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>.
                     a1_.t_ + 8));
  boost::detail::shared_count::~shared_count(&local_588);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base
            ((iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
              *)&ss);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &pr.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_4c0.l_.
                     super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                     .super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>.
                     a1_.t_ + 8));
  boost::detail::shared_count::~shared_count(&local_578);
  boost::range_detail::
  reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
  ::reversed_range((reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                    *)&ss,&canc_rng);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::iterator_range_base
            ((iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&pr,(iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
                     *)&ss);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base
            ((iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&ss);
  boost::foreach_detail_::
  begin<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
            ((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
              *)local_570,(foreach_detail_ *)&pr,(auto_any_t)0x0,
             (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
              *)0x0,in_R8);
  boost::foreach_detail_::
  end<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
            ((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
              *)&p_1,(foreach_detail_ *)&pr,(auto_any_t)0x0,
             (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
              *)0x0,in_R8);
  bVar4 = true;
  while ((bVar4 && ((pair<int,_int> *)local_570._0_8_ != _p_1))) {
    local_5d0 = boost::iterators::
                reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                ::dereference((reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                               *)local_570);
    local_610 = (reference)((ulong)local_5d0 >> 0x20);
    local_5c8 = ((long)local_5d0 >> 0x20) * 0x30;
    bVar4 = false;
    while (!bVar4) {
      p = local_5d0.first;
      pmVar10 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&contrib_map,&p);
      pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
      pmVar1 = pmVar8->m_conn[1].
               super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5c0 = (_Rb_tree_node_base *)
                  ((long)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header + local_5c8);
      bVar4 = true;
      p_Var14 = *(_Rb_tree_node_base **)
                 ((long)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header + local_5c8 + 0x10U);
      while ((bVar4 && (p_Var14 != local_5c0))) {
        qa = p_Var14[1]._M_color;
        bVar4 = false;
        local_5b8 = p_Var14;
        while (!bVar4) {
          pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
          bVar4 = mscomplex_t::is_not_paired(pmVar8,qa);
          if (bVar4) {
            bVar4 = true;
            std::vector<int,_std::allocator<int>_>::push_back(pmVar10,&qa);
          }
          else {
            pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
            pcVar11 = mscomplex_t::index(pmVar8,(char *)local_610,__c);
            pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
            pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
            uVar6 = mscomplex_t::pair_idx(pmVar9,qa);
            pcVar12 = mscomplex_t::index(pmVar8,(char *)(ulong)uVar6,__c_00);
            bVar4 = true;
            if ((int)pcVar11 == (int)pcVar12) {
              pmVar13 = std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::operator[](&contrib_map,&qa);
              piVar2 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              bVar4 = true;
              bVar3 = true;
              for (piVar17 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start; (bVar3 && (piVar17 != piVar2));
                  piVar17 = piVar17 + 1) {
                qaqa = *piVar17;
                bVar3 = false;
                while (!bVar3) {
                  std::vector<int,_std::allocator<int>_>::push_back(pmVar10,&qaqa);
                  pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                  bVar5 = mscomplex_t::is_not_paired(pmVar8,qaqa);
                  bVar3 = true;
                  if (!bVar5) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                    poVar15 = std::operator<<(local_3b8,"Failed to assert condition ");
                    poVar15 = std::operator<<(poVar15,"msc->is_not_paired(qaqa)");
                    poVar15 = std::operator<<(poVar15,"\n");
                    poVar15 = std::operator<<(poVar15,"at (");
                    poVar15 = std::operator<<(poVar15,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                             );
                    poVar15 = std::operator<<(poVar15,",");
                    poVar15 = std::operator<<(poVar15,"get_contrib_cps");
                    poVar15 = std::operator<<(poVar15,",");
                    poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x28e);
                    std::operator<<(poVar15,") \n ");
                    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar16,(string *)&p_);
                    __cxa_throw(prVar16,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
        }
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_5b8);
      }
      bVar4 = true;
    }
    boost::iterators::
    filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
    ::decrement((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                 *)local_570);
  }
  boost::iterators::
  filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
  ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                      *)&p_1);
  boost::iterators::
  filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
  ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                      *)local_570);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base
            ((iterator_range_base<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&pr);
  local_570._0_8_ = &canc_rng;
  boost::foreach_detail_::
  begin<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
            ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
              *)&ss,(foreach_detail_ *)local_570,(auto_any_t)0x0,
             (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
              *)0x0,(false_ *)in_R8);
  boost::foreach_detail_::
  end<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
            ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
              *)&pr,(foreach_detail_ *)local_570,(auto_any_t)0x0,
             (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
              *)0x0,(false_ *)in_R8);
  bVar4 = true;
  while ((bVar4 && (_ss != (pair<int,_int> *)CONCAT44(pr._4_4_,pr.first)))) {
    local_610 = boost::iterators::
                transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>
                ::dereference((transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>
                               *)&ss);
    bVar4 = false;
    while (!bVar4) {
      p_1 = local_610.first;
      pmVar10 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&contrib_map,&p_1);
      piVar2 = (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = true;
      for (piVar17 = (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; (bVar4 && (piVar17 != piVar2));
          piVar17 = piVar17 + 1) {
        p_ = *piVar17;
        bVar4 = false;
        while (!bVar4) {
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](local_5f8,&p_);
          std::vector<int,_std::allocator<int>_>::push_back(pmVar10,&p_1);
          bVar4 = true;
        }
      }
      bVar4 = true;
    }
    boost::iterators::
    filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
    ::increment((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                 *)&ss);
  }
  boost::iterators::
  filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
  ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                      *)&pr);
  boost::iterators::
  filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
  ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                      *)&ss);
  p_Var14 = (local_5f8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_610 = (reference)&(local_5f8->_M_t)._M_impl.super__Rb_tree_header;
  bVar4 = true;
  do {
    if ((!bVar4) || ((reference)p_Var14 == local_610)) {
      pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
      p = 0;
      local_5fc.super_type.m_iterator =
           SUB84((ulong)((long)(pmVar8->m_cp_cellid).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar8->m_cp_cellid).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2,0);
      local_5a0 = msc->px;
      local_598.pi_ = (msc->pn).pi_;
      if (local_598.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_598.pi_)->use_count_ = (local_598.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::
      bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
                (&local_418,(boost *)mscomplex_t::is_not_paired,0,&local_5a0);
      boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
                ((filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                  *)&p_1,(forwarder<boost::range_detail::filter_holder> *)
                         &boost::adaptors::(anonymous_namespace)::filtered,&local_418);
      boost::range_detail::operator|
                ((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                  *)local_570,
                 (iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>
                  *)&p,(filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                        *)&p_1);
      local_5b0 = msc->px;
      local_5a8.pi_ = (msc->pn).pi_;
      if (local_5a8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_5a8.pi_)->use_count_ = (local_5a8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::
      bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
                (&local_438,(boost *)mscomplex_t::is_index_i_cp<2>,0);
      boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
                ((filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                  *)&p_,(forwarder<boost::range_detail::filter_holder> *)
                        &boost::adaptors::(anonymous_namespace)::filtered,&local_438);
      boost::range_detail::operator|
                ((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                  *)&pr,(filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                         *)local_570,
                 (filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                  *)&p_);
      boost::iterator_range_detail::
      iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::iterator_range_base
                ((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
                  *)&ss,(iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
                         *)&pr);
      boost::iterator_range_detail::
      iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::~iterator_range_base
                ((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
                  *)&pr);
      boost::detail::shared_count::~shared_count(&local_5d8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&local_438.l_.
                         super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                         .
                         super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                         .a1_.t_ + 8));
      boost::detail::shared_count::~shared_count(&local_5a8);
      boost::iterator_range_detail::
      iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
      ::~iterator_range_base
                ((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                  *)local_570);
      boost::detail::shared_count::~shared_count(local_490);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&local_418.l_.
                         super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                         .
                         super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                         .a1_.t_ + 8));
      boost::detail::shared_count::~shared_count(&local_598);
      boost::foreach_detail_::
      begin<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                  *)&pr,(foreach_detail_ *)&ss,(auto_any_t)0x0,
                 (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                  *)0x0,in_R8);
      boost::foreach_detail_::
      end<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                  *)local_570,(foreach_detail_ *)&ss,(auto_any_t)0x0,
                 (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                  *)0x0,in_R8);
      bVar4 = true;
      while ((bVar4 && (pr.first != local_570._0_4_))) {
        p_1 = pr.first;
        bVar4 = false;
        while (!bVar4) {
          pmVar10 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](local_5f8,&p_1);
          std::vector<int,_std::allocator<int>_>::push_back(pmVar10,&p_1);
          bVar4 = true;
        }
        boost::iterators::
        filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
        ::increment((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                     *)&pr);
      }
      boost::iterators::
      filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
      ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                          *)local_570);
      boost::iterators::
      filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
      ::~filter_iterator((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                          *)&pr);
      boost::iterator_range_detail::
      iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::~iterator_range_base
                ((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>,_boost::iterators::incrementable_traversal_tag>
                  *)&ss);
      boost::iterator_range_detail::
      iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
      ::~iterator_range_base
                ((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                  *)&canc_rng);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&contrib_map._M_t);
      return;
    }
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
              (&pr,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var14 + 1));
    bVar4 = false;
    while (!bVar4) {
      pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
      pcVar11 = mscomplex_t::index(pmVar8,(char *)(ulong)(uint)pr.first,__c_01);
      if ((int)pcVar11 != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar15 = std::operator<<(local_3b8,"Failed to ensure condition ");
        poVar15 = std::operator<<(poVar15,"msc->index(pr.first) == dim");
        poVar15 = std::operator<<(poVar15,"\n");
        poVar15 = std::operator<<(poVar15,"at (");
        poVar15 = std::operator<<(poVar15,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                 );
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = std::operator<<(poVar15,"get_contrib_cps");
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x2a7);
        poVar15 = std::operator<<(poVar15,") \n ");
        poVar15 = std::operator<<(poVar15,"Message : ");
        poVar15 = std::operator<<(poVar15,"\"Computed the contribution of index != dim\"");
        std::operator<<(poVar15,"\n");
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar16,(string *)local_570);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
      bVar4 = mscomplex_t::is_not_paired(pmVar8,pr.first);
      piVar17 = pr.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (!bVar4) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar15 = std::operator<<(local_3b8,"Failed to ensure condition ");
        poVar15 = std::operator<<(poVar15,"msc->is_not_paired(pr.first)");
        poVar15 = std::operator<<(poVar15,"\n");
        poVar15 = std::operator<<(poVar15,"at (");
        poVar15 = std::operator<<(poVar15,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                 );
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = std::operator<<(poVar15,"get_contrib_cps");
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x2a9);
        poVar15 = std::operator<<(poVar15,") \n ");
        poVar15 = std::operator<<(poVar15,"Message : ");
        poVar15 = std::operator<<(poVar15,"\"Computed the contribution to a cancelled cp\"");
        std::operator<<(poVar15,"\n");
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar16,(string *)local_570);
        __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar4 = true;
      for (puVar18 = (uint *)pr.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
          (bVar4 && (puVar18 != (uint *)piVar17)); puVar18 = puVar18 + 1) {
        uVar6 = *puVar18;
        bVar4 = false;
        while (!bVar4) {
          pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
          pcVar11 = mscomplex_t::index(pmVar8,(char *)(ulong)uVar6,__c_02);
          if ((int)pcVar11 != 2) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar15 = std::operator<<(local_3b8,"Failed to ensure condition ");
            poVar15 = std::operator<<(poVar15,"msc->index(ccp) == dim");
            poVar15 = std::operator<<(poVar15,"\n");
            poVar15 = std::operator<<(poVar15,"at (");
            poVar15 = std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                     );
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = std::operator<<(poVar15,"get_contrib_cps");
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x2ae);
            poVar15 = std::operator<<(poVar15,") \n ");
            poVar15 = std::operator<<(poVar15,"Message : ");
            poVar15 = std::operator<<(poVar15,"\"other dim cp is attempting to contribute\"");
            std::operator<<(poVar15,"\n");
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar16,(string *)local_570);
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
          bVar4 = mscomplex_t::is_paired(pmVar8,uVar6);
          if (!bVar4) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar15 = std::operator<<(local_3b8,"Failed to ensure condition ");
            poVar15 = std::operator<<(poVar15,"msc->is_paired(ccp)");
            poVar15 = std::operator<<(poVar15,"\n");
            poVar15 = std::operator<<(poVar15,"at (");
            poVar15 = std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                     );
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = std::operator<<(poVar15,"get_contrib_cps");
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x2b0);
            poVar15 = std::operator<<(poVar15,") \n ");
            poVar15 = std::operator<<(poVar15,"Message : ");
            poVar15 = std::operator<<(poVar15,"\"an unpaired cp is attempting to contribute\"");
            std::operator<<(poVar15,"\n");
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar16,(string *)local_570);
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar8 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
          pmVar9 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
          uVar7 = mscomplex_t::pair_idx(pmVar9,uVar6);
          pcVar11 = mscomplex_t::index(pmVar8,(char *)(ulong)uVar7,__c_03);
          bVar4 = true;
          if ((int)pcVar11 != 1) {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar15 = std::operator<<(local_3b8,"Failed to ensure condition ");
            poVar15 = std::operator<<(poVar15,"msc->index(msc->pair_idx(ccp)) == odim");
            poVar15 = std::operator<<(poVar15,"\n");
            poVar15 = std::operator<<(poVar15,"at (");
            poVar15 = std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                     );
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = std::operator<<(poVar15,"get_contrib_cps");
            poVar15 = std::operator<<(poVar15,",");
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,0x2b2);
            poVar15 = std::operator<<(poVar15,") \n ");
            poVar15 = std::operator<<(poVar15,"Message : ");
            poVar15 = std::operator<<(poVar15,
                                      "\"wrong cancellation type cp is attempting to contribute\"");
            std::operator<<(poVar15,"\n");
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar16,(string *)local_570);
            __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      bVar4 = true;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pr.second.super__Vector_base<int,_std::allocator<int>_>);
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
  } while( true );
}

Assistant:

void get_contrib_cps(mscomplex_ptr_t msc,contrib_t& contrib)
{
  const eGDIR odir = (dir == ASC)?(DES):(ASC);
  const int   odim = (dir == ASC)?(dim +1):(dim -1);

  contrib_t contrib_map;

  // first, obtain a sequence of cancellations so that
  // a) each pair is ordered by dir ..
  //    i.e if dir is DES then look at a (2,1) as (2,1) and not (1,2)
  // b) pairs that have not yet been cancelled are removed
  // c) pairs whose first element have index == dim

  BOOST_AUTO(canc_rng,msc->m_canc_list
             |badpt::sliced(0,msc->m_multires_version)
             |badpt::transformed(bind(order_by_dir_index<dir>,msc,_1))
             |badpt::filtered(bind(is_dim_pair<dim,odim>,msc,_1))
             );

  // This part computes for each cancelled critical point,
  // the surviving critical points to which it contributes its
  // finest resolution geometry .
  BOOST_FOREACH(int_pair_t pr,canc_rng|badpt::reversed)
  {
    int p = pr.first,q = pr.second;

    int_list_t & pcontrib = contrib_map[p];

    // for each qa in the asc conn of q:
    BOOST_FOREACH(int qa, msc->m_conn[odir][q])
    {
      // a) if qa is not paired ..
      if(msc->is_not_paired(qa))
      {
        // .. p contributes to qa.
        pcontrib.push_back(qa);
      }
      // b) if qa is paired and qa's pair and q have same index ..
      else if(msc->index(q) == msc->index(msc->pair_idx(qa)))
      {
        // .. then foreach qaqa that qa contributes to  ..
        BOOST_FOREACH(int qaqa,contrib_map[qa])
        {
          // .. p contributes to qaqa.
          pcontrib.push_back(qaqa);

          // pdpd has to be a surviving cp
          ASSERT(msc->is_not_paired(qaqa));
        }
      }
    }
  }

  // This part just reverses info computed earlier.
  // i.e each surviving critical point will have a
  // list of cancelled critical points that contribute
  // their finest res geometry to it.

  BOOST_FOREACH(int_pair_t pr, canc_rng)
  {
    int p = pr.first;

    BOOST_FOREACH(int p_, contrib_map[p])
    {
      contrib[p_].push_back(p);
    }
  }

  // Sanity checks.
  BOOST_FOREACH(contrib_t::value_type pr, contrib)
  {
    ENSURE(msc->index(pr.first) == dim,
           "Computed the contribution of index != dim");
    ENSURE(msc->is_not_paired(pr.first),
           "Computed the contribution to a cancelled cp");

    BOOST_FOREACH(int ccp, pr.second)
    {
      ENSURE(msc->index(ccp) == dim,
             "other dim cp is attempting to contribute");
      ENSURE(msc->is_paired(ccp),
             "an unpaired cp is attempting to contribute");
      ENSURE(msc->index(msc->pair_idx(ccp)) == odim,
             "wrong cancellation type cp is attempting to contribute");
    }
  }

  // finally add each cp to its own list of contributors
  BOOST_FOREACH(int cp, msc->cp_range()
                |badpt::filtered(bind(&mscomplex_t::is_not_paired,msc,_1))
                |badpt::filtered(bind(&mscomplex_t::is_index_i_cp<dim>,msc,_1)))
  {
    contrib[cp].push_back(cp);
  }
}